

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void update_mem_availability(gen_ctx_t gen_ctx,bitmap_t mem_av,bb_insn_t_conflict mem_bb_insn)

{
  MIR_insn_t pMVar1;
  int iVar2;
  mem_expr_t pmVar3;
  bool bVar4;
  MIR_insn_t pMStack_48;
  int ld_p;
  MIR_op_t *mem_ref;
  MIR_insn_t mem_insn;
  bitmap_iterator_t bi;
  size_t nel;
  bb_insn_t_conflict mem_bb_insn_local;
  bitmap_t mem_av_local;
  gen_ctx_t gen_ctx_local;
  
  pMVar1 = mem_bb_insn->insn;
  pMStack_48 = (MIR_insn_t)pMVar1->ops;
  iVar2 = move_code_p((MIR_insn_code_t)*(undefined8 *)&mem_bb_insn->insn->field_0x18);
  if (iVar2 == 0) {
    __assert_fail("move_code_p (mem_bb_insn->insn->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xda9,"void update_mem_availability(gen_ctx_t, bitmap_t, bb_insn_t)");
  }
  bVar4 = (*(ushort *)&pMVar1->ops[0].field_0x8 & 0xff) != 0xb;
  if (bVar4) {
    pMStack_48 = mem_bb_insn->insn + 1;
  }
  if (((ulong)(pMStack_48->insn_link).prev & 0xff) == 0xb) {
    bitmap_iterator_init((bitmap_iterator_t *)&mem_insn,mem_av);
    while (iVar2 = bitmap_iterator_next((bitmap_iterator_t *)&mem_insn,&bi.nbit), iVar2 != 0) {
      pmVar3 = VARR_mem_expr_tget(gen_ctx->gvn_ctx->mem_exprs,bi.nbit);
      if ((!bVar4) &&
         (iVar2 = may_mem_alias_p(pmVar3->insn->ops +
                                  (int)(uint)((*(ushort *)&pmVar3->insn->ops[0].field_0x8 & 0xff) !=
                                             0xb),(MIR_op_t *)pMStack_48), iVar2 != 0)) {
        bitmap_clear_bit_p(mem_av,bi.nbit);
      }
    }
    bitmap_set_bit_p(mem_av,(ulong)mem_bb_insn->mem_index);
    return;
  }
  __assert_fail("mem_ref->mode == MIR_OP_VAR_MEM",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xdab,"void update_mem_availability(gen_ctx_t, bitmap_t, bb_insn_t)");
}

Assistant:

static void update_mem_availability (gen_ctx_t gen_ctx, bitmap_t mem_av, bb_insn_t mem_bb_insn) {
  size_t nel;
  bitmap_iterator_t bi;
  MIR_insn_t mem_insn;
  MIR_op_t *mem_ref = &mem_bb_insn->insn->ops[0];
  int ld_p;

  gen_assert (move_code_p (mem_bb_insn->insn->code));
  if ((ld_p = mem_ref->mode != MIR_OP_VAR_MEM)) mem_ref = &mem_bb_insn->insn->ops[1];
  gen_assert (mem_ref->mode == MIR_OP_VAR_MEM);
  FOREACH_BITMAP_BIT (bi, mem_av, nel) {
    mem_insn = VARR_GET (mem_expr_t, mem_exprs, nel)->insn;
    if (!ld_p
        && may_mem_alias_p (&mem_insn->ops[mem_insn->ops[0].mode == MIR_OP_VAR_MEM ? 0 : 1],
                            mem_ref))
      bitmap_clear_bit_p (mem_av, nel);
  }
  bitmap_set_bit_p (mem_av, mem_bb_insn->mem_index);
}